

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMImplementationRegistry.cpp
# Opt level: O0

DOMImplementation * xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(XMLCh *features)

{
  BaseRefVectorOf<xercesc_4_0::DOMImplementationSource> *this;
  int iVar1;
  DOMImplementationImpl *pDVar2;
  DOMImplementationSource *pDVar3;
  undefined4 extraout_var;
  DOMImplementationSource *local_78;
  DOMImplementation *impl;
  DOMImplementationSource *source;
  XMLSize_t i;
  DOMImplementationSource *local_28;
  XMLSize_t len;
  XMLMutexLock lock;
  XMLCh *features_local;
  
  lock.fToLock = (XMLMutex *)features;
  XMLMutexLock::XMLMutexLock((XMLMutexLock *)&len,gDOMImplSrcVectorMutex);
  local_28 = (DOMImplementationSource *)
             BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::size(gDOMImplSrcVector);
  this = gDOMImplSrcVector;
  if (local_28 == (DOMImplementationSource *)0x0) {
    pDVar2 = DOMImplementationImpl::getDOMImplementationImpl();
    local_78 = (DOMImplementationSource *)0x0;
    if (pDVar2 != (DOMImplementationImpl *)0x0) {
      local_78 = &pDVar2->super_DOMImplementationSource;
    }
    BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::addElement(this,local_78);
    local_28 = (DOMImplementationSource *)
               BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::size(gDOMImplSrcVector);
  }
  for (source = local_28; source != (DOMImplementationSource *)0x0;
      source = (DOMImplementationSource *)((long)&source[-1]._vptr_DOMImplementationSource + 7)) {
    pDVar3 = BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::elementAt
                       (gDOMImplSrcVector,
                        (XMLSize_t)((long)&source[-1]._vptr_DOMImplementationSource + 7));
    iVar1 = (*pDVar3->_vptr_DOMImplementationSource[2])(pDVar3,lock.fToLock);
    features_local = (XMLCh *)CONCAT44(extraout_var,iVar1);
    if (features_local != (XMLCh *)0x0) goto LAB_002fec03;
  }
  features_local = (XMLCh *)0x0;
LAB_002fec03:
  XMLMutexLock::~XMLMutexLock((XMLMutexLock *)&len);
  return (DOMImplementation *)features_local;
}

Assistant:

DOMImplementation *DOMImplementationRegistry::getDOMImplementation(const XMLCh* features) {

    XMLMutexLock lock(gDOMImplSrcVectorMutex);

    XMLSize_t len = gDOMImplSrcVector->size();

    // Put our defined source there
    if (len == 0) {
        gDOMImplSrcVector->addElement((DOMImplementationSource*)DOMImplementationImpl::getDOMImplementationImpl());

        len = gDOMImplSrcVector->size();
    }

    for (XMLSize_t i = len; i > 0; i--) {
        DOMImplementationSource* source = gDOMImplSrcVector->elementAt(i-1);
        DOMImplementation* impl = source->getDOMImplementation(features);
        if (impl)
            return impl;
    }

    return 0;
}